

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_function_impl.h
# Opt level: O0

void __thiscall
dlib::any_function<void(unsigned_long),void,1ul>::
any_function<dlib::member_function_pointer<unsigned_long,void,void,void>>
          (any_function<void_(unsigned_long),_void,_1UL> *this,
          member_function_pointer<unsigned_long,_void,_void,_void> *item)

{
  derived<dlib::member_function_pointer<unsigned_long,_void,_void,_void>,_void_(unsigned_long)>
  *in_RSI;
  unique_ptr<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>,_std::default_delete<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_>_>
  *in_RDI;
  unique_ptr<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>,_std::default_delete<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_>_>
  *this_00;
  member_function_pointer<unsigned_long,_void,_void,_void> *in_stack_ffffffffffffffe8;
  
  this_00 = in_RDI;
  std::
  unique_ptr<dlib::any_function<void(unsigned_long),void,1ul>::Tbase<void(unsigned_long)>,std::default_delete<dlib::any_function<void(unsigned_long),void,1ul>::Tbase<void(unsigned_long)>>>
  ::
  unique_ptr<std::default_delete<dlib::any_function<void(unsigned_long),void,1ul>::Tbase<void(unsigned_long)>>,void>
            (in_RDI);
  operator_new(0x50);
  any_function<void_(unsigned_long),_void,_1UL>::
  derived<dlib::member_function_pointer<unsigned_long,_void,_void,_void>,_void_(unsigned_long)>::
  derived(in_RSI,in_stack_ffffffffffffffe8);
  std::
  unique_ptr<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>,_std::default_delete<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_>_>
  ::reset(this_00,(pointer)in_RDI);
  return;
}

Assistant:

any_function (
    const T& item
)
{
    typedef typename basic_type<T>::type U;
    data.reset(new derived<U,function_type>(item));
}